

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::EdgeEvent
          (Sweep *this,SweepContext *tcx,Point *ep,Point *eq,Triangle *triangle,Point *point)

{
  bool bVar1;
  Orientation OVar2;
  Orientation OVar3;
  Point *pPVar4;
  runtime_error *prVar5;
  Orientation o2;
  Point *p2;
  Orientation o1;
  Point *p1;
  Point *point_local;
  Triangle *triangle_local;
  Point *eq_local;
  Point *ep_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  bVar1 = IsEdgeSideOfTriangle(this,triangle,ep,eq);
  if (!bVar1) {
    pPVar4 = Triangle::PointCCW(triangle,point);
    OVar2 = Orient2d(eq,pPVar4,ep);
    if (OVar2 == COLLINEAR) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"EdgeEvent - collinear points not supported");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pPVar4 = Triangle::PointCW(triangle,point);
    OVar3 = Orient2d(eq,pPVar4,ep);
    if (OVar3 == COLLINEAR) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"EdgeEvent - collinear points not supported");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (OVar2 == OVar3) {
      if (OVar2 == CW) {
        point_local = (Point *)Triangle::NeighborCCW(triangle,point);
      }
      else {
        point_local = (Point *)Triangle::NeighborCW(triangle,point);
      }
      EdgeEvent(this,tcx,ep,eq,(Triangle *)point_local,point);
    }
    else {
      FlipEdgeEvent(this,tcx,ep,eq,triangle,point);
    }
  }
  return;
}

Assistant:

void Sweep::EdgeEvent(SweepContext& tcx, Point& ep, Point& eq, Triangle* triangle, Point& point)
{
  if (IsEdgeSideOfTriangle(*triangle, ep, eq)) {
    return;
  }

  Point* p1 = triangle->PointCCW(point);
  Orientation o1 = Orient2d(eq, *p1, ep);
  if (o1 == COLLINEAR) {
	  // ASSIMP_CHANGE (aramis_acg)
	  throw std::runtime_error("EdgeEvent - collinear points not supported");
    if( triangle->Contains(&eq, p1)) {
      triangle->MarkConstrainedEdge(&eq, p1 );
      // We are modifying the constraint maybe it would be better to
      // not change the given constraint and just keep a variable for the new constraint
      tcx.edge_event.constrained_edge->q = p1;
      triangle = &triangle->NeighborAcross(point);
      EdgeEvent( tcx, ep, *p1, triangle, *p1 );
    } else {
	  // ASSIMP_CHANGE (aramis_acg)
      std::runtime_error("EdgeEvent - collinear points not supported");
    }
    return;
  }

  Point* p2 = triangle->PointCW(point);
  Orientation o2 = Orient2d(eq, *p2, ep);
  if (o2 == COLLINEAR) {
	  // ASSIMP_CHANGE (aramis_acg)
	  throw std::runtime_error("EdgeEvent - collinear points not supported");

    if( triangle->Contains(&eq, p2)) {
      triangle->MarkConstrainedEdge(&eq, p2 );
      // We are modifying the constraint maybe it would be better to
      // not change the given constraint and just keep a variable for the new constraint
      tcx.edge_event.constrained_edge->q = p2;
      triangle = &triangle->NeighborAcross(point);
      EdgeEvent( tcx, ep, *p2, triangle, *p2 );
    } else {
      // ASSIMP_CHANGE (aramis_acg)
      throw std::runtime_error("EdgeEvent - collinear points not supported");
    }
    return;
  }

  if (o1 == o2) {
    // Need to decide if we are rotating CW or CCW to get to a triangle
    // that will cross edge
    if (o1 == CW) {
      triangle = triangle->NeighborCCW(point);
    }       else{
      triangle = triangle->NeighborCW(point);
    }
    EdgeEvent(tcx, ep, eq, triangle, point);
  } else {
    // This triangle crosses constraint so lets flippin start!
    FlipEdgeEvent(tcx, ep, eq, triangle, point);
  }
}